

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_hash_set * ggml_hash_set_new(ggml_hash_set *__return_storage_ptr__,size_t size)

{
  size_t sVar1;
  ggml_tensor **ppgVar2;
  ggml_bitset_t *pgVar3;
  
  sVar1 = ggml_hash_size(size);
  __return_storage_ptr__->size = sVar1;
  ppgVar2 = (ggml_tensor **)ggml_malloc(sVar1 * 8);
  __return_storage_ptr__->keys = ppgVar2;
  if (sVar1 + 0x1f < 0x20) {
    pgVar3 = (ggml_bitset_t *)0x0;
    ggml_log_internal(GGML_LOG_LEVEL_WARN,
                      "Behavior may be unexpected when allocating 0 bytes for ggml_calloc!\n");
  }
  else {
    pgVar3 = (ggml_bitset_t *)calloc(sVar1 + 0x1f >> 5,4);
    if (pgVar3 == (ggml_bitset_t *)0x0) {
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %6.2f MB\n",0x3ed0000000000000,
                        "ggml_calloc");
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
                 ,0x152,"fatal error");
    }
  }
  __return_storage_ptr__->used = pgVar3;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_hash_set ggml_hash_set_new(size_t size) {
    size = ggml_hash_size(size);
    struct ggml_hash_set result;
    result.size = size;
    result.keys = GGML_MALLOC(sizeof(struct ggml_tensor *) * size);
    result.used = GGML_CALLOC(ggml_bitset_size(size), sizeof(ggml_bitset_t));
    return result;
}